

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.cpp
# Opt level: O3

int duckdb_lz4::LZ4_compress_destSize(char *src,char *dst,int *srcSizePtr,int targetDstSize)

{
  uint srcSize;
  int iVar1;
  tableType_t tableType;
  LZ4_stream_t ctxBody;
  
  iVar1 = 0;
  switchD_010444a0::default(&ctxBody,0,0x4020);
  srcSize = *srcSizePtr;
  if (srcSize < 0x7e000001) {
    iVar1 = (uint)((ulong)srcSize * 0x8080808081 >> 0x27) + 0x10;
  }
  if (targetDstSize < iVar1) {
    if ((int)srcSize < 0x1000b) {
      tableType = byU16;
    }
    else {
      tableType = byU32;
    }
    iVar1 = LZ4_compress_generic
                      (&ctxBody.internal_donotuse,src,dst,srcSize,srcSizePtr,targetDstSize,
                       fillOutput,tableType,noDict,noDictIssue,1);
  }
  else {
    iVar1 = LZ4_compress_fast_extState(&ctxBody,src,dst,srcSize,targetDstSize,1);
  }
  return iVar1;
}

Assistant:

int LZ4_compress_destSize(const char* src, char* dst, int* srcSizePtr, int targetDstSize)
{
#if (LZ4_HEAPMODE)
    LZ4_stream_t* ctx = (LZ4_stream_t*)ALLOC(sizeof(LZ4_stream_t));   /* malloc-calloc always properly aligned */
    if (ctx == NULL) return 0;
#else
    LZ4_stream_t ctxBody;
    LZ4_stream_t* ctx = &ctxBody;
#endif

    int result = LZ4_compress_destSize_extState(ctx, src, dst, srcSizePtr, targetDstSize);

#if (LZ4_HEAPMODE)
    FREEMEM(ctx);
#endif
    return result;
}